

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O2

int cli::extract(Parser *parse,Option *options)

{
  int iVar1;
  Entry *pEVar2;
  long lVar3;
  pointer ppEVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  Version VVar8;
  Compression CVar9;
  uint uVar10;
  ostream *poVar11;
  pointer ppEVar12;
  Version version;
  Compression compression;
  uint32_t size_00;
  uint32_t size_01;
  uint32_t size_02;
  uint32_t size_03;
  uint32_t size_04;
  undefined8 extraout_RDX;
  undefined8 uVar13;
  undefined8 extraout_RDX_00;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  char *data;
  string outPath;
  size_t size;
  EntryList filelist;
  EntryList list;
  Archive archive;
  string path;
  fstream stream;
  int local_238;
  char local_230 [512];
  
  if (parse->nonop_count < 1) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Filename required");
    std::endl<char,std::char_traits<char>>(poVar11);
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,*parse->nonop_args,(allocator<char> *)&stream);
  ZAP::Archive::Archive(&archive);
  bVar5 = ZAP::Archive::openFile(&archive,&path);
  if (bVar5) {
    if (options[2].desc == (Descriptor *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outPath,".",(allocator<char> *)&stream);
      if (1 < parse->nonop_count) {
        std::__cxx11::string::assign((char *)&outPath);
      }
      bVar5 = isDirectory(&outPath);
      if (bVar5) {
        list.
        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list.
        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list.
        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ZAP::Archive::getFileList(&archive,&list);
        ppEVar4 = list.
                  super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar12 = list.
                        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppEVar12 != ppEVar4;
            ppEVar12 = ppEVar12 + 1) {
          pEVar2 = *ppEVar12;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream,&outPath,'/');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &filelist,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stream,&pEVar2->virtual_path);
          std::__cxx11::string::~string((string *)&stream);
          cleanPath((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filelist);
          bVar6 = createPath((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &filelist);
          if (bVar6) {
            std::fstream::fstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                       (char *)filelist.
                               super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,_S_trunc|_S_out|_S_bin);
            cVar7 = std::__basic_file<char>::is_open();
            if (cVar7 == '\0') {
              poVar11 = std::operator<<((ostream *)&std::cerr,"Could not create entry ");
              poVar11 = std::operator<<(poVar11,(string *)pEVar2);
              std::endl<char,std::char_traits<char>>(poVar11);
            }
            else {
              if (options[7].desc == (Descriptor *)0x0) {
                bVar6 = ZAP::Archive::getData(&archive,pEVar2,&data,&size);
              }
              else {
                bVar6 = ZAP::Archive::getRawData(&archive,pEVar2,&data,&size);
              }
              if (bVar6 == false) {
                poVar11 = std::operator<<((ostream *)&std::cerr,"Could not extract entry ");
                poVar11 = std::operator<<(poVar11,(string *)pEVar2);
                std::endl<char,std::char_traits<char>>(poVar11);
              }
              else {
                std::ostream::write(local_230,(long)data);
                if (data != (char *)0x0) {
                  operator_delete__(data);
                }
              }
            }
            std::fstream::~fstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream)
            ;
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cerr,"Could not create path ");
            poVar11 = std::operator<<(poVar11,(string *)&filelist);
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          std::__cxx11::string::~string((string *)&filelist);
        }
        std::_Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ::~_Vector_base(&list.
                         super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                       );
      }
      else {
        poVar11 = std::operator<<((ostream *)&std::cerr,"Output is not a directory");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      std::__cxx11::string::~string((string *)&outPath);
      if (!bVar5) goto LAB_00104cde;
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"Version: ");
      VVar8 = ZAP::Archive::getVersion(&archive);
      getPrettyVersion_abi_cxx11_((string *)&stream,(cli *)(ulong)VVar8,version);
      poVar11 = std::operator<<(poVar11,(string *)&stream);
      poVar11 = std::operator<<(poVar11,"\nCompression: ");
      CVar9 = ZAP::Archive::getCompression(&archive);
      getPrettyCompression_abi_cxx11_(&outPath,(cli *)(ulong)CVar9,compression);
      poVar11 = std::operator<<(poVar11,(string *)&outPath);
      bVar5 = ZAP::Archive::isSupportedCompression(&archive);
      pcVar18 = " (unsupported)";
      if (bVar5) {
        pcVar18 = " (supported)";
      }
      poVar11 = std::operator<<(poVar11,pcVar18);
      poVar11 = std::operator<<(poVar11,"\nFile count: ");
      ZAP::Archive::getFileCount(&archive);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::operator<<(poVar11,"\n\n");
      std::__cxx11::string::~string((string *)&outPath);
      std::__cxx11::string::~string((string *)&stream);
      filelist.
      super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filelist.
      super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      filelist.
      super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ZAP::Archive::getFileList(&archive,&filelist);
      ppEVar4 = filelist.
                super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar15 = 5;
      iVar14 = 0xb;
      iVar16 = 0xd;
      uVar13 = extraout_RDX;
      for (ppEVar12 = filelist.
                      super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; lVar3 = std::cout,
          ppEVar12 != ppEVar4; ppEVar12 = ppEVar12 + 1) {
        pEVar2 = *ppEVar12;
        iVar1 = (int)(pEVar2->virtual_path)._M_string_length;
        getPrettySize_abi_cxx11_
                  ((string *)&stream,(cli *)(ulong)pEVar2->compressed_size,(uint32_t)uVar13);
        std::__cxx11::string::~string((string *)&stream);
        getPrettySize_abi_cxx11_((string *)&stream,(cli *)(ulong)pEVar2->decompressed_size,size_00);
        std::__cxx11::string::~string((string *)&stream);
        if (iVar15 <= iVar1) {
          iVar15 = iVar1 + 1;
        }
        if (iVar14 <= local_238) {
          iVar14 = local_238 + 1;
        }
        if (iVar16 <= local_238) {
          iVar16 = local_238 + 1;
        }
        uVar13 = extraout_RDX_00;
      }
      *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) | 0x20;
      *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) = (long)iVar15
      ;
      poVar11 = std::operator<<((ostream *)&std::cout,"Path");
      lVar3 = *(long *)poVar11;
      *(uint *)(poVar11 + *(long *)(lVar3 + -0x18) + 0x18) =
           *(uint *)(poVar11 + *(long *)(lVar3 + -0x18) + 0x18) | 0x80;
      *(long *)(poVar11 + *(long *)(lVar3 + -0x18) + 0x10) = (long)iVar14;
      poVar11 = std::operator<<(poVar11,"Comp. size");
      *(long *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = (long)iVar16;
      poVar11 = std::operator<<(poVar11,"Decomp. size");
      *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
           *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffff7f;
      std::operator<<(poVar11,'\n');
      ppEVar4 = filelist.
                super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar17 = 0;
      uVar10 = 0;
      for (ppEVar12 = filelist.
                      super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; lVar3 = std::cout,
          ppEVar12 != ppEVar4; ppEVar12 = ppEVar12 + 1) {
        pEVar2 = *ppEVar12;
        uVar10 = uVar10 + pEVar2->compressed_size;
        uVar17 = uVar17 + pEVar2->decompressed_size;
        *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) | 0x20;
        *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) =
             (long)iVar15;
        poVar11 = std::operator<<((ostream *)&std::cout,(string *)pEVar2);
        lVar3 = *(long *)poVar11;
        *(uint *)(poVar11 + *(long *)(lVar3 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(lVar3 + -0x18) + 0x18) | 0x80;
        *(long *)(poVar11 + *(long *)(lVar3 + -0x18) + 0x10) = (long)iVar14;
        getPrettySize_abi_cxx11_((string *)&stream,(cli *)(ulong)pEVar2->compressed_size,size_01);
        poVar11 = std::operator<<(poVar11,(string *)&stream);
        *(long *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = (long)iVar16;
        getPrettySize_abi_cxx11_(&outPath,(cli *)(ulong)pEVar2->decompressed_size,size_02);
        poVar11 = std::operator<<(poVar11,(string *)&outPath);
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffff7f;
        std::operator<<(poVar11,'\n');
        std::__cxx11::string::~string((string *)&outPath);
        std::__cxx11::string::~string((string *)&stream);
      }
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x10;
      poVar11 = std::operator<<((ostream *)&std::cout,"\nTotal comp.: ");
      getPrettySize_abi_cxx11_((string *)&stream,(cli *)(ulong)uVar10,size_03);
      poVar11 = std::operator<<(poVar11,(string *)&stream);
      *(undefined8 *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = 0x10;
      poVar11 = std::operator<<(poVar11,"\nTotal decomp.: ");
      getPrettySize_abi_cxx11_(&outPath,(cli *)(ulong)uVar17,size_04);
      poVar11 = std::operator<<(poVar11,(string *)&outPath);
      std::operator<<(poVar11,'\n');
      std::__cxx11::string::~string((string *)&outPath);
      std::__cxx11::string::~string((string *)&stream);
      std::ostream::flush();
      std::_Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>::
      ~_Vector_base(&filelist.
                     super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                   );
    }
    iVar15 = 0;
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Could not open archive");
    std::endl<char,std::char_traits<char>>(poVar11);
LAB_00104cde:
    iVar15 = 1;
  }
  ZAP::Archive::~Archive(&archive);
  std::__cxx11::string::~string((string *)&path);
  return iVar15;
}

Assistant:

int extract(option::Parser &parse, option::Option *options)
	{
		if (parse.nonOptionsCount() < 1)
		{
			std::cerr << "Filename required" << std::endl;
			return 1;
		}
		std::string path = parse.nonOption(0);

		ZAP::Archive archive;
		if (!archive.openFile(path))
		{
			std::cerr << "Could not open archive" << std::endl;
			return 1;
		}

		if (options[LIST])
		{
			print(archive);
		}
		else
		{
			std::string outPath = ".";
			if (parse.nonOptionsCount() >= 2)
			{
				outPath = parse.nonOption(1);
			}
			if (!isDirectory(outPath))
			{
				std::cerr << "Output is not a directory" << std::endl;
				return 1;
			}

			ZAP::Archive::EntryList list;
			archive.getFileList(list);

			for (const ZAP::Archive::Entry *entry : list)
			{
				std::string fullpath = (outPath + '/' + entry->virtual_path);
				cleanPath(fullpath);
				if (!createPath(fullpath))
				{
					std::cerr << "Could not create path " << fullpath << std::endl;
					continue;
				}

				std::fstream stream(fullpath.c_str(), std::ios::out | std::ios::binary | std::ios::trunc);
				if (!stream.is_open())
				{
					std::cerr << "Could not create entry " << entry->virtual_path << std::endl;
					continue;
				}

				char *data;
				size_t size;

				bool extractSuccess = false;
				if (options[RAW])
					extractSuccess = archive.getRawData(entry, data, size);
				else
					extractSuccess = archive.getData(entry, data, size);

				if (!extractSuccess)
				{
					std::cerr << "Could not extract entry " << entry->virtual_path << std::endl;
					continue;
				}

				stream.write(data, size);

				delete[] data;
			}
		}

		return 0;
	}